

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *value)

{
  int iVar1;
  undefined8 *puVar2;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  Rep *pRVar6;
  void **ppvVar7;
  Nonnull<const_char_*> pcVar8;
  
  if (value == (Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *)0x0) {
    pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       ((void *)0x0,(void *)0x0,"value != nullptr");
  }
  else {
    pcVar8 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar8 != (Nonnull<const_char_*>)0x0) {
    UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
  }
  bVar4 = SizeAtCapacity(this);
  if (bVar4) {
    InternalExtend(this,1);
  }
  else {
    bVar4 = AllocatedSizeAtCapacity(this);
    iVar1 = this->current_size_;
    if (bVar4) {
      ppvVar7 = element_at(this,iVar1);
      puVar2 = (undefined8 *)*ppvVar7;
      if ((puVar2 != (undefined8 *)0x0) && (this->arena_ == (Arena *)0x0)) {
        if ((long *)*puVar2 != puVar2 + 2) {
          operator_delete((long *)*puVar2,puVar2[2] + 1);
        }
        operator_delete(puVar2,0x20);
      }
      goto LAB_00475bf5;
    }
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      uVar5 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar6 = rep(this);
      uVar5 = pRVar6->allocated_size;
    }
    if (iVar1 < (int)uVar5) {
      ppvVar7 = element_at(this,this->current_size_);
      pvVar3 = *ppvVar7;
      if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
        uVar5 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
      }
      else {
        pRVar6 = rep(this);
        uVar5 = pRVar6->allocated_size;
      }
      ppvVar7 = element_at(this,uVar5);
      *ppvVar7 = pvVar3;
    }
    else if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) goto LAB_00475bf5;
  }
  pRVar6 = rep(this);
  pRVar6->allocated_size = pRVar6->allocated_size + 1;
LAB_00475bf5:
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  ppvVar7 = element_at(this,iVar1);
  *ppvVar7 = value;
  return;
}

Assistant:

void UnsafeArenaAddAllocated(Value<TypeHandler>* value) {
    ABSL_DCHECK_NE(value, nullptr);
    // Make room for the new pointer.
    if (SizeAtCapacity()) {
      // The array is completely full with no cleared objects, so grow it.
      InternalExtend(1);
      ++rep()->allocated_size;
    } else if (AllocatedSizeAtCapacity()) {
      // There is no more space in the pointer array because it contains some
      // cleared objects awaiting reuse.  We don't want to grow the array in
      // this case because otherwise a loop calling AddAllocated() followed by
      // Clear() would leak memory.
      using H = CommonHandler<TypeHandler>;
      Delete<H>(element_at(current_size_), arena_);
    } else if (current_size_ < allocated_size()) {
      // We have some cleared objects.  We don't care about their order, so we
      // can just move the first one to the end to make space.
      element_at(allocated_size()) = element_at(current_size_);
      ++rep()->allocated_size;
    } else {
      // There are no cleared objects.
      if (!using_sso()) ++rep()->allocated_size;
    }

    element_at(ExchangeCurrentSize(current_size_ + 1)) = value;
  }